

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O2

void __thiscall OpenMD::Rattle::Rattle(Rattle *this,SimInfo *info)

{
  Globals *pGVar1;
  Parameter<double> *pPVar2;
  uint uVar3;
  ConstraintWriter *this_00;
  SimInfo *pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  this->info_ = info;
  this->maxConsIteration_ = 10;
  this->consTolerance_ = 1e-06;
  this->currentSnapshot_ = (Snapshot *)0x0;
  this->doRattle_ = false;
  (this->constraintOutputFile_)._M_dataplus._M_p = (pointer)&(this->constraintOutputFile_).field_2;
  (this->constraintOutputFile_)._M_string_length = 0;
  (this->constraintOutputFile_).field_2._M_local_buf[0] = '\0';
  this->constraintWriter_ = (ConstraintWriter *)0x0;
  this->currConstraintTime_ = 0.0;
  uVar3 = SimInfo::getNGlobalConstraints(info);
  if (uVar3 == 0) {
    if ((this->doRattle_ & 1U) == 0) {
      return;
    }
  }
  else {
    this->doRattle_ = true;
  }
  pSVar4 = this->info_;
  pGVar1 = pSVar4->simParams_;
  if ((pGVar1->Dt).super_ParameterBase.empty_ == false) {
    this->dt_ = (pGVar1->Dt).data_;
  }
  else {
    builtin_strncpy(painCave.errMsg + 0x10," is not set\n",0xd);
    builtin_strncpy(painCave.errMsg,"Rattle Error: dt",0x10);
    painCave.isFatal = 1;
    simError();
    pSVar4 = this->info_;
  }
  this->currentSnapshot_ = pSVar4->sman_->currentSnapshot_;
  pPVar2 = &pGVar1->ConstraintTime;
  if ((pGVar1->ConstraintTime).super_ParameterBase.empty_ != false) {
    pPVar2 = &pGVar1->StatusTime;
  }
  this->constraintTime_ = pPVar2->data_;
  std::__cxx11::string::string((string *)&local_40,(string *)&pSVar4->finalConfigFileName_);
  getPrefix(&local_60,&local_40);
  std::operator+(&local_80,&local_60,".constraintForces");
  std::__cxx11::string::operator=((string *)&this->constraintOutputFile_,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = (ConstraintWriter *)operator_new(0x208);
  pSVar4 = this->info_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,(this->constraintOutputFile_)._M_dataplus._M_p,
             (allocator<char> *)&local_60);
  ConstraintWriter::ConstraintWriter(this_00,pSVar4,&local_80);
  this->constraintWriter_ = this_00;
  std::__cxx11::string::~string((string *)&local_80);
  if (this->constraintWriter_ == (ConstraintWriter *)0x0) {
    builtin_strncpy(painCave.errMsg,"Failed to create ConstraintWriter\n",0x23);
    painCave.isFatal = 1;
    simError();
  }
  return;
}

Assistant:

Rattle::Rattle(SimInfo* info) :
      info_(info), maxConsIteration_(10), consTolerance_(1.0e-6),
      doRattle_(false), currConstraintTime_(0.0) {
    if (info_->getNGlobalConstraints() > 0) doRattle_ = true;

    if (!doRattle_) return;

    Globals* simParams = info_->getSimParams();

    if (simParams->haveDt()) {
      dt_ = simParams->getDt();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Rattle Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (simParams->haveConstraintTime()) {
      constraintTime_ = simParams->getConstraintTime();
    } else {
      constraintTime_ = simParams->getStatusTime();
    }

    constraintOutputFile_ =
        getPrefix(info_->getFinalConfigFileName()) + ".constraintForces";

    // create ConstraintWriter
    constraintWriter_ =
        new ConstraintWriter(info_, constraintOutputFile_.c_str());

    if (!constraintWriter_) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Failed to create ConstraintWriter\n");
      painCave.isFatal = 1;
      simError();
    }
  }